

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

bool tfs::setupDnn1(Dnn *dnn)

{
  bool bVar1;
  unsigned_long uVar2;
  Dnn *in_RDI;
  unsigned_long count;
  unsigned_long expected_count;
  DnnBuilder builder;
  unsigned_long in_stack_ffffffffffffff88;
  Activation activation;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  DnnBuilder *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  DnnBuilder local_20;
  bool local_1;
  
  DnnBuilder::DnnBuilder(&local_20,in_RDI,ACTIVATION_DEFAULT);
  bVar1 = DnnBuilder::addLayerInput
                    ((DnnBuilder *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     (unsigned_long)in_stack_ffffffffffffff98,
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
  activation = (Activation)(in_stack_ffffffffffffff88 >> 0x20);
  if (bVar1) {
    bVar1 = DnnBuilder::addLayerFullyConnected
                      (in_stack_ffffffffffffff98,
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),activation);
    if (bVar1) {
      bVar1 = DnnBuilder::addLayerFullyConnected
                        (in_stack_ffffffffffffff98,
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),activation);
      if (bVar1) {
        bVar1 = DnnBuilder::addLayerFullyConnected
                          (in_stack_ffffffffffffff98,
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),activation)
        ;
        if (bVar1) {
          bVar1 = DnnBuilder::addLayerSoftmax
                            (in_stack_ffffffffffffff98,
                             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
          if (bVar1) {
            Dnn::initialize((Dnn *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
            uVar2 = Dnn::count((Dnn *)0x117fb0);
            if (uVar2 == 9) {
              local_1 = true;
            }
            else {
              local_1 = report_problem("Error",
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                       ,"setupDnn1",0x26,"We have set up %lu layers, expected %lu",
                                       uVar2,9);
            }
          }
          else {
            local_1 = report_problem("Error",
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                     ,"setupDnn1",0x20,"Cannot add Softmax layer");
          }
        }
        else {
          local_1 = report_problem("Error",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                   ,"setupDnn1",0x1d,"Cannot add Fully Connected layer");
        }
      }
      else {
        local_1 = report_problem("Error",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                 ,"setupDnn1",0x1a,"Cannot add Fully Connected layer");
      }
    }
    else {
      local_1 = report_problem("Error",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                               ,"setupDnn1",0x17,"Cannot add Fully Connected layer");
    }
  }
  else {
    local_1 = report_problem("Error",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                             ,"setupDnn1",0x14,"Cannot add Input layer");
  }
  DnnBuilder::~DnnBuilder(&local_20);
  return (bool)(local_1 & 1);
}

Assistant:

static bool
    setupDnn1( Dnn &dnn ) {                                      // Same DNN for all 2d tests.
        DnnBuilder builder( dnn, ACTIVATION_TANH );
        if( !builder.addLayerInput( 1, 1, 2 )) {                // Input layer a single x, y data point.
            return log_error( "Cannot add Input layer" );
        }
        if( !builder.addLayerFullyConnected( 8 )) {             // 8 Neurons
            return log_error( "Cannot add Fully Connected layer" );
        }
        if( !builder.addLayerFullyConnected( 6 )) {             // 6 Neurons
            return log_error( "Cannot add Fully Connected layer" );
        }
        if( !builder.addLayerFullyConnected( 2 )) {             // 2 Neurons
            return log_error( "Cannot add Fully Connected layer" );
        }
        if( !builder.addLayerSoftmax( 2 )) {                    // Output classifier, 2 classes.
            return log_error( "Cannot add Softmax layer" );
        }
        dnn.initialize();                                       // Randomize the weights.
        const unsigned long expected_count = 9;
        const unsigned long count = dnn.count();
        if( count != expected_count ) {
            return log_error( "We have set up %lu layers, expected %lu", count, expected_count );
        }
        return true;
    }